

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Functional::ShaderSourceReplaceCase::generateSecondSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceReplaceCase *this)

{
  ShaderSourceReplaceCase *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,"#version 100\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"precision highp float;\n\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"void main()\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"{\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\tfloat variable = 1.0;\n");
  if (this->m_shaderType == SHADERTYPE_VERTEX) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"\tgl_Position = vec4(variable);\n");
  }
  else if (this->m_shaderType == SHADERTYPE_FRAGMENT) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"\tgl_FragColor = vec4(variable);\n");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}\n");
  return __return_storage_ptr__;
}

Assistant:

std::string generateSecondSource (void)
	{
		std::string str;

		str  = "#version 100\n";
		str += "precision highp float;\n\n";

		str += "void main()\n";
		str += "{\n";
		str += "	float variable = 1.0;\n";

		if		(m_shaderType == glu::SHADERTYPE_VERTEX)	str += "	gl_Position = vec4(variable);\n";
		else if	(m_shaderType == glu::SHADERTYPE_FRAGMENT)	str += "	gl_FragColor = vec4(variable);\n";

		str += "}\n";

		return str;
	}